

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint auto_choose_color(LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,LodePNGColorStats *stats
                      )

{
  uchar **ppuVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  LodePNGColorType LVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  uVar8 = stats->numpixels;
  uVar4 = stats->key;
  uVar3 = stats->alpha;
  uVar2 = stats->bits;
  mode_out->key_defined = 0;
  bVar10 = uVar4 == 0;
  bVar9 = 0x10 < uVar8;
  uVar7 = 8;
  if (8 < uVar2) {
    uVar7 = uVar2;
  }
  if (bVar9 || bVar10) {
    uVar7 = uVar2;
  }
  uVar2 = stats->numcolors;
  bVar11 = stats->colored == 0;
  bVar12 = stats->allow_greyscale != 0;
  uVar5 = 8;
  if (7 < uVar7) {
    uVar5 = uVar7;
  }
  if (bVar12 && bVar11) {
    uVar5 = uVar7;
  }
  uVar7 = 1;
  if ((2 < (ulong)uVar2) && (uVar7 = 2, 4 < uVar2)) {
    uVar7 = (uint)(0x10 < uVar2) * 4 + 4;
  }
  bVar13 = uVar3 == 0;
  if ((((stats->allow_palette == 0) ||
       (((bVar12 && bVar11) && ((bVar9 || bVar10) && bVar13)) && uVar5 <= uVar7)) ||
      (uVar2 - 0x101 < 0xffffff00)) || ((uVar8 < (ulong)uVar2 * 2 || (8 < uVar5)))) {
    mode_out->bitdepth = uVar5;
    LVar6 = (uint)(!bVar12 || !bVar11) * 2;
    if (!bVar9 && !bVar10 || !bVar13) {
      LVar6 = (uint)(!bVar12 || !bVar11) * 2 + LCT_GREY_ALPHA;
    }
    mode_out->colortype = LVar6;
    uVar3 = 0;
    if (uVar4 != 0 && 0x10 < uVar8) {
      uVar4 = ~(-1 << ((byte)uVar5 & 0x1f));
      mode_out->key_r = stats->key_r & uVar4;
      mode_out->key_g = stats->key_g & uVar4;
      mode_out->key_b = stats->key_b & uVar4;
      mode_out->key_defined = 1;
      uVar3 = 0;
    }
  }
  else {
    ppuVar1 = &mode_out->palette;
    if (mode_out->palette != (uchar *)0x0) {
      free(mode_out->palette);
    }
    *ppuVar1 = (uchar *)0x0;
    mode_out->palettesize = 0;
    if (stats->numcolors == 0) {
      uVar3 = 0;
    }
    else {
      uVar8 = 0;
      do {
        uVar3 = lodepng_palette_add(mode_out,stats->palette[uVar8 * 4],stats->palette[uVar8 * 4 + 1]
                                    ,stats->palette[uVar8 * 4 + 2],stats->palette[uVar8 * 4 + 3]);
        if (uVar3 != 0) goto LAB_0012300e;
        uVar8 = uVar8 + 1;
      } while (uVar8 != stats->numcolors);
      uVar3 = 0;
    }
LAB_0012300e:
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar7;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar7)) {
      if (*ppuVar1 != (uchar *)0x0) {
        free(*ppuVar1);
      }
      *ppuVar1 = (uchar *)0x0;
      mode_out->palettesize = 0;
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  return uVar3;
}

Assistant:

static unsigned auto_choose_color(LodePNGColorMode* mode_out,
                                  const LodePNGColorMode* mode_in,
                                  const LodePNGColorStats* stats) {
  unsigned error = 0;
  unsigned palettebits;
  size_t i, n;
  size_t numpixels = stats->numpixels;
  unsigned palette_ok, gray_ok;

  unsigned alpha = stats->alpha;
  unsigned key = stats->key;
  unsigned bits = stats->bits;

  mode_out->key_defined = 0;

  if(key && numpixels <= 16) {
    alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    key = 0;
    if(bits < 8) bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }

  gray_ok = !stats->colored;
  if(!stats->allow_greyscale) gray_ok = 0;
  if(!gray_ok && bits < 8) bits = 8;

  n = stats->numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && bits <= 8 && n != 0; /*n==0 means likely numcolors wasn't computed*/
  if(numpixels < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(gray_ok && !alpha && bits <= palettebits) palette_ok = 0; /*gray is less overhead*/
  if(!stats->allow_palette) palette_ok = 0;

  if(palette_ok) {
    const unsigned char* p = stats->palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != stats->numcolors; ++i) {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth) {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  } else /*8-bit or 16-bit per channel*/ {
    mode_out->bitdepth = bits;
    mode_out->colortype = alpha ? (gray_ok ? LCT_GREY_ALPHA : LCT_RGBA)
                                : (gray_ok ? LCT_GREY : LCT_RGB);
    if(key) {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*stats always uses 16-bit, mask converts it*/
      mode_out->key_r = stats->key_r & mask;
      mode_out->key_g = stats->key_g & mask;
      mode_out->key_b = stats->key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}